

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

TrodesConfig * __thiscall TrodesConfig::operator=(TrodesConfig *this,TrodesConfig *obj)

{
  EVP_PKEY_CTX *in_RDX;
  TrodesConfig *in_RSI;
  TrodesConfig *in_RDI;
  TrodesConfig *objCpy;
  TrodesConfig *in_stack_ffffffffffffffa8;
  vector<NDevice,_std::allocator<NDevice>_> *in_stack_ffffffffffffffb8;
  vector<NDevice,_std::allocator<NDevice>_> *in_stack_ffffffffffffffc0;
  
  copy(in_RSI,(EVP_PKEY_CTX *)in_RSI,in_RDX);
  getDevices(in_stack_ffffffffffffffa8);
  std::vector<NDevice,_std::allocator<NDevice>_>::operator=
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<NDevice,_std::allocator<NDevice>_>::~vector(in_stack_ffffffffffffffc0);
  getNTrodes(in_stack_ffffffffffffffa8);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::operator=
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_ffffffffffffffc0,
             (vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_ffffffffffffffb8);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_ffffffffffffffc0);
  return in_RDI;
}

Assistant:

TrodesConfig& TrodesConfig::operator = (const TrodesConfig &obj) {
    TrodesConfig *objCpy = obj.copy();
    devices = objCpy->getDevices();
    nTrodes = objCpy->getNTrodes();
    return(*this);
}